

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ulong uVar5;
  ImGuiWindow *pIVar6;
  ImGuiWindow *pIVar7;
  ulong uVar8;
  byte bVar9;
  ulong extraout_RDX;
  ImGuiPopupData *pIVar10;
  long lVar11;
  ulong uVar12;
  ImGuiContext *g;
  bool bVar13;
  ImRect IVar14;
  
  pIVar4 = GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((pIVar6 = GImGui->NavWindow, pIVar6 == (ImGuiWindow *)0x0 || (pIVar6->Appearing == false)))) {
    if ((GImGui->IO).MouseClicked[0] == true) {
      pIVar7 = GImGui->HoveredRootWindow;
      if ((pIVar7 == (ImGuiWindow *)0x0) || ((pIVar7->Flags & 0x4000000) == 0)) {
        bVar13 = false;
      }
      else {
        uVar8 = (ulong)(GImGui->OpenPopupStack).Size;
        bVar13 = 0 < (long)uVar8;
        if (0 < (long)uVar8) {
          pIVar10 = (GImGui->OpenPopupStack).Data;
          bVar13 = true;
          if (pIVar10->PopupId != pIVar7->PopupId) {
            uVar5 = 1;
            do {
              uVar12 = uVar5;
              pIVar10 = pIVar10 + 1;
              if (uVar8 == uVar12) break;
              uVar5 = uVar12 + 1;
            } while (pIVar10->PopupId != pIVar7->PopupId);
            bVar13 = uVar12 < uVar8;
          }
        }
        bVar13 = (bool)(bVar13 ^ 1);
      }
      if ((pIVar7 == (ImGuiWindow *)0x0) || (bVar13)) {
        if ((pIVar6 != (ImGuiWindow *)0x0 && pIVar7 == (ImGuiWindow *)0x0) &&
           (pIVar6 = GetTopMostPopupModal(), pIVar6 == (ImGuiWindow *)0x0)) {
          FocusWindow((ImGuiWindow *)0x0);
        }
      }
      else {
        StartMouseMovingWindow(GImGui->HoveredWindow);
        if (((pIVar4->IO).ConfigWindowsMoveFromTitleBarOnly == true) && ((pIVar7->Flags & 1) == 0))
        {
          IVar14 = ImGuiWindow::TitleBarRect(pIVar7);
          fVar1 = (pIVar4->IO).MouseClickedPos[0].x;
          if ((fVar1 < IVar14.Min.x) ||
             (((fVar2 = (pIVar4->IO).MouseClickedPos[0].y, fVar2 < IVar14.Min.y ||
               (IVar14.Max.x <= fVar1)) || (IVar14.Max.y <= fVar2)))) {
            pIVar4->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
        if (pIVar4->HoveredIdDisabled == true) {
          pIVar4->MovingWindow = (ImGuiWindow *)0x0;
        }
      }
    }
    if ((pIVar4->IO).MouseClicked[1] == true) {
      pIVar7 = GetTopMostPopupModal();
      pIVar6 = pIVar4->HoveredWindow;
      if (pIVar6 != (ImGuiWindow *)0x0) {
        lVar11 = (long)(GImGui->Windows).Size;
        uVar8 = extraout_RDX;
        while (0 < lVar11) {
          pIVar3 = (GImGui->Windows).Data[lVar11 + -1];
          bVar9 = (byte)uVar8 & pIVar3 != pIVar7 | pIVar3 == pIVar6;
          uVar8 = (ulong)bVar9;
          if ((pIVar3 == pIVar7) || (lVar11 = lVar11 + -1, pIVar3 == pIVar6)) goto LAB_0011a18c;
        }
        bVar9 = 0;
LAB_0011a18c:
        if (bVar9 != 0) {
          pIVar7 = pIVar6;
        }
      }
      ClosePopupsOverWindow(pIVar7,true);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click on empty space to focus window and start moving
    // (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        // Handle the edge case of a popup being closed while clicking in its empty space.
        // If we try to focus it, FocusWindow() > ClosePopupsOverWindow() will accidentally close any parent popups because they are not linked together any more.
        ImGuiWindow* root_window = g.HoveredRootWindow;
        const bool is_closed_popup = root_window && (root_window->Flags & ImGuiWindowFlags_Popup) && !IsPopupOpen(root_window->PopupId, ImGuiPopupFlags_AnyPopupLevel);

        if (root_window != NULL && !is_closed_popup)
        {
            StartMouseMovingWindow(g.HoveredWindow); //-V595

            // Cancel moving if clicked outside of title bar
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(root_window->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!root_window->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;

            // Cancel moving if clicked over an item which was disabled or inhibited by popups (note that we know HoveredId == 0 already)
            if (g.HoveredIdDisabled)
                g.MovingWindow = NULL;
        }
        else if (root_window == NULL && g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = g.HoveredWindow && IsWindowAbove(g.HoveredWindow, modal);
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}